

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

void FStateDefinitions::RetargetStatePointers
               (intptr_t count,char *target,TArray<FStateDefine,_FStateDefine> *statelist)

{
  uint uVar1;
  FStateDefine *pFVar2;
  FState *pFVar3;
  uint local_24;
  uint i;
  TArray<FStateDefine,_FStateDefine> *statelist_local;
  char *target_local;
  intptr_t count_local;
  
  for (local_24 = 0; uVar1 = TArray<FStateDefine,_FStateDefine>::Size(statelist), local_24 < uVar1;
      local_24 = local_24 + 1) {
    pFVar2 = TArray<FStateDefine,_FStateDefine>::operator[](statelist,(ulong)local_24);
    if ((pFVar2->State == (FState *)count) &&
       (pFVar2 = TArray<FStateDefine,_FStateDefine>::operator[](statelist,(ulong)local_24),
       pFVar2->DefineFlags == '\x05')) {
      if (target == (char *)0x0) {
        pFVar2 = TArray<FStateDefine,_FStateDefine>::operator[](statelist,(ulong)local_24);
        pFVar2->State = (FState *)0x0;
        pFVar2 = TArray<FStateDefine,_FStateDefine>::operator[](statelist,(ulong)local_24);
        pFVar2->DefineFlags = '\x02';
      }
      else {
        pFVar3 = (FState *)copystring(target);
        pFVar2 = TArray<FStateDefine,_FStateDefine>::operator[](statelist,(ulong)local_24);
        pFVar2->State = pFVar3;
        pFVar2 = TArray<FStateDefine,_FStateDefine>::operator[](statelist,(ulong)local_24);
        pFVar2->DefineFlags = '\x04';
      }
    }
    pFVar2 = TArray<FStateDefine,_FStateDefine>::operator[](statelist,(ulong)local_24);
    uVar1 = TArray<FStateDefine,_FStateDefine>::Size(&pFVar2->Children);
    if (uVar1 != 0) {
      pFVar2 = TArray<FStateDefine,_FStateDefine>::operator[](statelist,(ulong)local_24);
      RetargetStatePointers(count,target,&pFVar2->Children);
    }
  }
  return;
}

Assistant:

void FStateDefinitions::RetargetStatePointers (intptr_t count, const char *target, TArray<FStateDefine> & statelist)
{
	for(unsigned i = 0;i<statelist.Size(); i++)
	{
		if (statelist[i].State == (FState*)count && statelist[i].DefineFlags == SDF_INDEX)
		{
			if (target == NULL)
			{
				statelist[i].State = NULL;
				statelist[i].DefineFlags = SDF_STOP;
			}
			else
			{
				statelist[i].State = (FState *)copystring (target);
				statelist[i].DefineFlags = SDF_LABEL;
			}
		}
		if (statelist[i].Children.Size() > 0)
		{
			RetargetStatePointers(count, target, statelist[i].Children);
		}
	}
}